

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O1

SQString * __thiscall SQStringTable::Add(SQStringTable *this,SQChar *news,SQInteger len)

{
  SQString **ppSVar1;
  int iVar2;
  SQString *pSVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (len < 0) {
    len = strlen(news);
  }
  uVar4 = 0xcbf29ce484222325;
  if (len == 0) {
    uVar4 = 0xcbf29ce484222325;
  }
  else {
    uVar5 = len;
    do {
      uVar4 = ((long)news[uVar5 - 1] ^ uVar4) * 0x100000001b3;
      uVar5 = uVar5 + ~((ulong)len >> 5);
    } while ((ulong)len >> 5 < uVar5);
  }
  uVar5 = this->_numofslots - 1 & uVar4;
  pSVar3 = this->_strings[uVar5];
  while( true ) {
    if (pSVar3 == (SQString *)0x0) {
      pSVar3 = (SQString *)sq_vm_malloc(this->_sharedstate->_alloc_ctx,len + 0x40);
      (pSVar3->super_SQRefCounted)._uiRef = 0;
      (pSVar3->super_SQRefCounted)._weakref = (SQWeakRef *)0x0;
      (pSVar3->super_SQRefCounted)._vptr_SQRefCounted = (_func_int **)&PTR__SQRefCounted_001a5110;
      pSVar3->_sharedstate = this->_sharedstate;
      memcpy(pSVar3->_val,news,len);
      pSVar3->_val[len] = '\0';
      pSVar3->_len = len;
      pSVar3->_hash = uVar4;
      ppSVar1 = this->_strings;
      pSVar3->_next = ppSVar1[uVar5];
      ppSVar1[uVar5] = pSVar3;
      uVar4 = this->_slotused + 1;
      this->_slotused = uVar4;
      if (this->_numofslots < uVar4) {
        Resize(this,this->_numofslots * 2);
      }
      return pSVar3;
    }
    if ((pSVar3->_len == len) && (iVar2 = bcmp(news,pSVar3->_val,len), iVar2 == 0)) break;
    pSVar3 = pSVar3->_next;
  }
  return pSVar3;
}

Assistant:

SQString *SQStringTable::Add(const SQChar *news,SQInteger len)
{
    if(len<0)
        len = (SQInteger)strlen(news);
    SQHash newhash = ::_hashstr(news,len);
    SQHash h = newhash&(_numofslots-1);
    SQString *s;
    for (s = _strings[h]; s; s = s->_next){
        if(s->_len == len && (!memcmp(news,s->_val,len)))
            return s; //found
    }

    SQString *t = (SQString *)SQ_MALLOC(_sharedstate->_alloc_ctx, len+sizeof(SQString));
    new (t) SQString;
    t->_sharedstate = _sharedstate;
    memcpy(t->_val,news,len);
    t->_val[len] = _SC('\0');
    t->_len = len;
    t->_hash = newhash;
    t->_next = _strings[h];
    _strings[h] = t;
    _slotused++;
    if (_slotused > _numofslots)  /* too crowded? */
        Resize(_numofslots*2);
    return t;
}